

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RoboSimian::RoboSimian
          (RoboSimian *this,ChContactMethod contact_method,bool has_sled,bool fixed)

{
  ChSystem *this_00;
  ContactManager *this_01;
  ContactMaterial *this_02;
  ChSystemNSC *local_110;
  void *local_e8;
  ChVector<double> local_60;
  undefined1 local_41;
  ChSystemSMC *local_40;
  undefined1 local_31;
  ChSystemNSC *local_30;
  allocator local_26;
  allocator local_25 [15];
  byte local_16;
  byte local_15;
  ChContactMethod local_14;
  bool fixed_local;
  bool has_sled_local;
  RoboSimian *pRStack_10;
  ChContactMethod contact_method_local;
  RoboSimian *this_local;
  
  this->m_owns_system = true;
  local_16 = fixed;
  local_15 = has_sled;
  local_14 = contact_method;
  pRStack_10 = this;
  std::shared_ptr<chrono::robosimian::RS_Chassis>::shared_ptr(&this->m_chassis);
  std::shared_ptr<chrono::robosimian::RS_Sled>::shared_ptr(&this->m_sled);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ::vector(&this->m_limbs);
  this->m_wheel_mode = SPEED;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_chassis_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_sled_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheel_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_link_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheelDD_material);
  this->m_wheel_friction = 0.8;
  this->m_sled_friction = 0.8;
  std::shared_ptr<chrono::robosimian::RS_Driver>::shared_ptr(&this->m_driver);
  this_01 = (ContactManager *)operator_new(0x10);
  ContactManager::ContactManager(this_01);
  this->m_contact_reporter = this_01;
  this->m_material_override = (ContactMaterial *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_outdir,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_root,"results",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  local_e8 = &this->field_0x108;
  do {
    std::ofstream::ofstream(local_e8);
    local_e8 = (void *)((long)local_e8 + 0x200);
  } while ((RoboSimian *)local_e8 != this + 1);
  local_31 = 0;
  local_41 = 0;
  if (local_14 == NSC) {
    local_110 = (ChSystemNSC *)operator_new(0x380);
    local_31 = 1;
    local_30 = local_110;
    chrono::ChSystemNSC::ChSystemNSC(local_110,true);
  }
  else {
    local_110 = (ChSystemNSC *)operator_new(0x3a8);
    local_41 = 1;
    local_40 = (ChSystemSMC *)local_110;
    chrono::ChSystemSMC::ChSystemSMC((ChSystemSMC *)local_110,true);
  }
  this->m_system = (ChSystem *)local_110;
  this_00 = this->m_system;
  ChVector<double>::ChVector(&local_60,0.0,0.0,-9.81);
  ChSystem::Set_G_acc(this_00,&local_60);
  chrono::ChSystem::SetSolverMaxIterations((int)this->m_system);
  ChSystem::SetMaxPenetrationRecoverySpeed(this->m_system,4.0);
  chrono::ChSystem::SetSolverType((Type)this->m_system);
  Create(this,(bool)(local_15 & 1),(bool)(local_16 & 1));
  if (local_14 == NSC) {
    this_02 = (ContactMaterial *)operator_new(0x10);
    ContactMaterial::ContactMaterial(this_02,this);
    this->m_material_override = this_02;
  }
  return;
}

Assistant:

RoboSimian::RoboSimian(ChContactMethod contact_method, bool has_sled, bool fixed)
    : m_owns_system(true),
      m_wheel_mode(ActuationMode::SPEED),
      m_contact_reporter(new ContactManager),
      m_material_override(nullptr),
      m_sled_friction(0.8f),
      m_wheel_friction(0.8f),
      m_outdir(""),
      m_root("results") {
    m_system = (contact_method == ChContactMethod::NSC) ? static_cast<ChSystem*>(new ChSystemNSC)
                                                        : static_cast<ChSystem*>(new ChSystemSMC);
    m_system->Set_G_acc(ChVector<>(0, 0, -9.81));

    // Integration and Solver settings
    m_system->SetSolverMaxIterations(150);
    m_system->SetMaxPenetrationRecoverySpeed(4.0);
    m_system->SetSolverType(ChSolver::Type::BARZILAIBORWEIN);

    Create(has_sled, fixed);

    //// TODO: currently, only NSC multicore systems support user override of composite materials
    if (contact_method == ChContactMethod::NSC) {
        m_material_override = new ContactMaterial(this);
    }
}